

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

NullableValue<kj::Rc<kj::Refcounted>_> * __thiscall
kj::_::NullableValue<kj::Rc<kj::Refcounted>_>::operator=
          (NullableValue<kj::Rc<kj::Refcounted>_> *this,
          NullableValue<kj::Rc<kj::Refcounted>_> *other)

{
  Refcounted *pRVar1;
  
  if (other != this) {
    if (this->isSet == true) {
      this->isSet = false;
      Own<kj::Refcounted,_std::nullptr_t>::dispose(&(this->field_1).value.own);
    }
    if (other->isSet == true) {
      pRVar1 = (other->field_1).value.own.ptr;
      (this->field_1).value.own.disposer = (other->field_1).value.own.disposer;
      (this->field_1).value.own.ptr = pRVar1;
      (other->field_1).value.own.ptr = (Refcounted *)0x0;
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }